

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

void Vec_IntSetEntry(Vec_Int_t *p,int i,int Entry)

{
  int Entry_local;
  int i_local;
  Vec_Int_t *p_local;
  
  Vec_IntFillExtra(p,i + 1,0);
  Vec_IntWriteEntry(p,i,Entry);
  return;
}

Assistant:

static inline void Vec_IntSetEntry( Vec_Int_t * p, int i, int Entry )
{
    Vec_IntFillExtra( p, i + 1, 0 );
    Vec_IntWriteEntry( p, i, Entry );
}